

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

LPCWSTR __thiscall Js::RecyclableObjectDisplay::Type(RecyclableObjectDisplay *this)

{
  StringBuilder<Memory::ArenaAllocator> *this_00;
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  RecyclableObject *originalInstance;
  JavascriptFunction *this_01;
  FunctionProxy *pFVar4;
  ParseableFunctionInfo *pPVar5;
  undefined4 extraout_var;
  char16 *pcVar6;
  Var local_28;
  Var value;
  
  bVar1 = TaggedInt::Is(this->instance);
  if (bVar1) {
    return L"Number";
  }
  if ((ulong)this->instance >> 0x32 == 0) {
    originalInstance = VarTo<Js::RecyclableObject>(this->instance);
    this_00 = this->scriptContext->threadContext->debugManager->pCurrentInterpreterLocation->
              stringBuilder;
    this_00->length = 0;
    this_00->count = 0;
    this_00->lastChunk = (Data *)0x0;
    this_00->firstChunk = (Data *)0x0;
    this_00->secondChunk = (Data *)0x0;
    local_28 = (Var)0x0;
    if ((((originalInstance->type).ptr)->typeId == TypeIds_Object) &&
       (BVar2 = GetPropertyWithScriptEnter
                          (originalInstance,originalInstance,0x67,&local_28,this->scriptContext),
       BVar2 != 0)) {
      StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<7ul>(this_00,(char16 (*) [7])0xff98ee)
      ;
      bVar1 = VarIs<Js::JavascriptFunction>(local_28);
      if (bVar1) {
        this_01 = VarTo<Js::JavascriptFunction>(local_28);
        pFVar4 = JavascriptFunction::GetFunctionProxy(this_01);
        if (pFVar4 != (FunctionProxy *)0x0) {
          pFVar4 = JavascriptFunction::GetFunctionProxy(this_01);
          pPVar5 = FunctionProxy::EnsureDeserialized(pFVar4);
          if (pPVar5 != (ParseableFunctionInfo *)0x0) {
            iVar3 = (*(pPVar5->super_FunctionProxy).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pPVar5);
            if ((char16 *)CONCAT44(extraout_var,iVar3) != (char16 *)0x0) {
              StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<4ul>
                        (this_00,(char16 (*) [4])L", (");
              StringBuilder<Memory::ArenaAllocator>::AppendSz
                        (this_00,(char16 *)CONCAT44(extraout_var,iVar3));
              StringBuilder<Memory::ArenaAllocator>::Append(this_00,L')');
            }
          }
        }
      }
    }
    else {
      iVar3 = (*(originalInstance->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x51])(originalInstance,this_00,this->scriptContext);
      if (iVar3 == 0) {
        return L"Undefined";
      }
    }
    pcVar6 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
    return pcVar6;
  }
  return L"Number";
}

Assistant:

LPCWSTR RecyclableObjectDisplay::Type()
    {
        LPCWSTR typeStr;

        if(Js::TaggedInt::Is(instance) || Js::JavascriptNumber::Is(instance))
        {
            typeStr = _u("Number");
        }
        else
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(instance);

            StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
            builder->Reset();

            // For the RecyclableObject try to find out the constructor, which will be shown as type for the object.
            // This case is to handle the user defined function, built in objects have dedicated classes to handle.

            Var value = nullptr;
            TypeId typeId = obj->GetTypeId();
            if (typeId == TypeIds_Object && GetPropertyWithScriptEnter(obj, obj, PropertyIds::constructor, &value, scriptContext))
            {
                builder->AppendCppLiteral(_u("Object"));
                if (Js::VarIs<Js::JavascriptFunction>(value))
                {
                    Js::JavascriptFunction *pfunction = Js::VarTo<Js::JavascriptFunction>(value);
                    // For an odd chance that the constructor wasn't called to create the object.
                    Js::ParseableFunctionInfo *pFuncBody = pfunction->GetFunctionProxy() != nullptr ? pfunction->GetFunctionProxy()->EnsureDeserialized() : nullptr;
                    if (pFuncBody)
                    {
                        const char16* pDisplayName = pFuncBody->GetDisplayName();
                        if (pDisplayName)
                        {
                            builder->AppendCppLiteral(_u(", ("));
                            builder->AppendSz(pDisplayName);
                            builder->Append(_u(')'));
                        }
                    }
                }
                typeStr = builder->Detach();
            }
            else if (obj->GetDiagTypeString(builder, scriptContext))
            {
                typeStr = builder->Detach();
            }
            else
            {
                typeStr = _u("Undefined");
            }
        }

        return typeStr;
    }